

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4xor.hpp
# Opt level: O2

void __thiscall
trng::lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>::discard
          (lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *this,unsigned_long_long n)

{
  unsigned_long_long uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  size_type k;
  uint uVar5;
  bool bVar6;
  vector_type V;
  matrix_type M;
  vector_type W;
  
  uVar1 = int_math::log2_ceil<unsigned_long_long>(n);
  if (uVar1 * 0x86de8d9 < n) {
    matrix<trng::GF2,_521UL>::matrix(&M);
    lVar2 = 1;
    for (lVar3 = lVar2; lVar3 != 0x209; lVar3 = lVar3 + 1) {
      M.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
      super__Vector_impl_data._M_start[lVar2].value = '\x01';
      lVar2 = lVar2 + 0x20a;
    }
    M.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.super__Vector_impl_data
    ._M_start[0x42248].value = '\x01';
    M.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.super__Vector_impl_data
    ._M_start[0x4235f].value = '\x01';
    M.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.super__Vector_impl_data
    ._M_start[0x42384].value = '\x01';
    M.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.super__Vector_impl_data
    ._M_start[0x423a9].value = '\x01';
    power<trng::GF2,521ul>
              ((matrix<trng::GF2,_521UL> *)&V,(trng *)&M,(matrix<trng::GF2,_521UL> *)(n - 0x209),
               0x201);
    std::vector<trng::GF2,_std::allocator<trng::GF2>_>::_M_move_assign(&M.data);
    std::_Vector_base<trng::GF2,_std::allocator<trng::GF2>_>::~_Vector_base
              ((_Vector_base<trng::GF2,_std::allocator<trng::GF2>_> *)&V);
    vector<unsigned_int,_521UL>::vector(&V);
    for (lVar2 = 0; lVar2 != -0x209; lVar2 = lVar2 + -1) {
      V.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar2 + 0x208] =
           (this->S).r[(this->S).index + (int)lVar2 & 0x3ff];
    }
    vector<unsigned_int,_521UL>::vector(&W);
    for (lVar2 = 0; lVar2 != 0x209; lVar2 = lVar2 + 1) {
      uVar4 = 0;
      for (lVar3 = 0; lVar3 != 0x209; lVar3 = lVar3 + 1) {
        uVar5 = 0;
        if (M.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3].value != '\0') {
          uVar5 = V.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar3];
        }
        uVar4 = uVar4 ^ uVar5;
      }
      W.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar2] = uVar4;
      M.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
      super__Vector_impl_data._M_start =
           M.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
           super__Vector_impl_data._M_start + 0x209;
    }
    uVar4 = (int)(matrix<trng::GF2,_521UL> *)(n - 0x209) + (this->S).index;
    (this->S).index = uVar4 & 0x3ff;
    for (lVar2 = 0; lVar2 != -0x209; lVar2 = lVar2 + -1) {
      (this->S).r[uVar4 + (int)lVar2 & 0x3ff] =
           W.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar2 + 0x208];
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&W);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&V);
    std::_Vector_base<trng::GF2,_std::allocator<trng::GF2>_>::~_Vector_base
              ((_Vector_base<trng::GF2,_std::allocator<trng::GF2>_> *)&M);
    n = 0x209;
  }
  while (bVar6 = n != 0, n = n - 1, bVar6) {
    step(this);
  }
  return;
}

Assistant:

void discard(unsigned long long n) {
      const unsigned int matrix_size = D;
      using matrix_type = matrix<GF2, matrix_size>;
      using vector_type = vector<result_type, matrix_size>;
      using size_type = typename matrix_type::size_type;
      const unsigned long long n_pivot{int_math::log2_ceil(n) * D * D * D};
      constexpr auto mask = int_math::mask(D);
      if (n > n_pivot) {
        const unsigned long long n_partial{n - matrix_size};
        matrix_type M;
        for (size_type i{0}; i < matrix_size - 1; ++i)
          M(i, i + 1) = GF2(true);
        M(matrix_size - 1, matrix_size - D) = GF2(true);
        M(matrix_size - 1, matrix_size - C) = GF2(true);
        M(matrix_size - 1, matrix_size - B) = GF2(true);
        M(matrix_size - 1, matrix_size - A) = GF2(true);
        M = power(M, n_partial);
        vector_type V;
        for (size_type i{0}; i < matrix_size; ++i)
          V(matrix_size - 1 - i) = S.r[(S.index - i) & mask];
        vector_type W;
        for (size_type i{0}; i < matrix_size; ++i) {
          result_type sum{};
          for (size_type k{0}; k < matrix_size; ++k)
            sum ^= M(i, k) * V(k);
          W(i) = sum;
        }
        S.index = static_cast<unsigned int>(S.index + n_partial);
        S.index &= mask;
        for (size_type i{0}; i < matrix_size; ++i)
          S.r[(S.index - i) & mask] = W(matrix_size - 1 - i);
        n -= n_partial;
      }
      for (unsigned long long i{0}; i < n; ++i)
        step();
    }